

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O0

bool __thiscall quadtree::Box<float>::intersects(Box<float> *this,Box<float> *box)

{
  float fVar1;
  float fVar2;
  bool local_19;
  Box<float> *box_local;
  Box<float> *this_local;
  
  fVar2 = this->left;
  fVar1 = getRight(box);
  local_19 = true;
  if (fVar2 < fVar1) {
    fVar2 = getRight(this);
    local_19 = true;
    if (box->left < fVar2) {
      fVar2 = this->top;
      fVar1 = getBottom(box);
      local_19 = true;
      if (fVar2 < fVar1) {
        fVar2 = getBottom(this);
        local_19 = fVar2 <= box->top;
      }
    }
  }
  return (bool)((local_19 ^ 0xffU) & 1);
}

Assistant:

constexpr bool intersects(const Box<T>& box) const noexcept
    {
        return !(left >= box.getRight() || getRight() <= box.left ||
            top >= box.getBottom() || getBottom() <= box.top);
    }